

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SGP4.cc
# Opt level: O2

void libsgp4::SGP4::DeepSpacePeriodics
               (double tsince,DeepSpaceConstants *ds_constants,double *em,double *xinc,
               double *omgasm,double *xnodes,double *xll)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  
  dVar14 = tsince * 1.19459e-05 + ds_constants->zmos;
  dVar5 = sin(dVar14);
  dVar14 = dVar5 * 0.0335 + dVar14;
  dVar6 = sin(dVar14);
  dVar19 = cos(dVar14);
  dVar10 = ds_constants->se3;
  dVar11 = ds_constants->se2;
  dVar12 = ds_constants->si2;
  dVar13 = ds_constants->si3;
  dVar5 = ds_constants->sl2;
  dVar14 = ds_constants->sl3;
  dVar1 = ds_constants->sgh2;
  dVar2 = ds_constants->sgh3;
  dVar16 = ds_constants->sh2;
  dVar17 = ds_constants->sh3;
  dVar7 = tsince * 0.00015835218 + ds_constants->zmol;
  dVar3 = ds_constants->sl4;
  dVar4 = ds_constants->sgh4;
  dVar8 = sin(dVar7);
  dVar7 = dVar8 * 0.1098 + dVar7;
  dVar9 = sin(dVar7);
  dVar20 = cos(dVar7);
  dVar19 = dVar19 * dVar6 * -0.5;
  dVar20 = dVar20 * dVar9 * -0.5;
  dVar15 = dVar6 * 0.5 * dVar6 + -0.25;
  dVar18 = dVar9 * 0.5 * dVar9 + -0.25;
  dVar7 = ds_constants->e3;
  dVar8 = ds_constants->ee2;
  dVar5 = ds_constants->xl4 * dVar9 + ds_constants->xl2 * dVar18 + ds_constants->xl3 * dVar20 +
          dVar5 * dVar15 + dVar14 * dVar19 + dVar3 * dVar6;
  dVar14 = dVar9 * ds_constants->xgh4 + ds_constants->xgh2 * dVar18 + ds_constants->xgh3 * dVar20 +
           dVar1 * dVar15 + dVar2 * dVar19 + dVar4 * dVar6;
  dVar16 = dVar18 * ds_constants->xh2 + dVar20 * ds_constants->xh3 +
           dVar16 * dVar15 + dVar17 * dVar19;
  dVar17 = ds_constants->xi2 * dVar18 + ds_constants->xi3 * dVar20 +
           dVar12 * dVar15 + dVar13 * dVar19;
  *xinc = *xinc + dVar17;
  *em = dVar8 * dVar18 + dVar7 * dVar20 + dVar11 * dVar15 + dVar10 * dVar19 + *em;
  dVar1 = sin(*xinc);
  dVar2 = cos(*xinc);
  if (0.2 <= *xinc) {
    *omgasm = (dVar14 - (dVar2 * dVar16) / dVar1) + *omgasm;
    *xnodes = dVar16 / dVar1 + *xnodes;
    *xll = dVar5 + *xll;
  }
  else {
    dVar8 = sin(*xnodes);
    dVar6 = cos(*xnodes);
    dVar3 = *xnodes;
    dVar4 = floor(dVar3 / 6.283185307179586);
    dVar3 = dVar4 * -6.283185307179586 + dVar3;
    *xnodes = dVar3;
    dVar4 = *xll;
    dVar7 = *omgasm;
    dVar16 = atan2(dVar16 * dVar6 + dVar17 * dVar2 * dVar8 + dVar1 * dVar8,
                   (dVar17 * dVar2 * dVar6 - dVar16 * dVar8) + dVar1 * dVar6);
    if (3.141592653589793 < ABS(dVar3 - dVar16)) {
      dVar16 = dVar16 + *(double *)(&DAT_0010ac30 + (ulong)(dVar16 < dVar3) * 8);
    }
    *xnodes = dVar16;
    dVar16 = *xll;
    *xll = dVar5 + dVar16;
    *omgasm = ((((dVar14 + dVar5) - dVar17 * dVar3 * dVar1) + dVar2 * dVar3 + dVar4 + dVar7) -
              (dVar5 + dVar16)) - *xnodes * dVar2;
  }
  return;
}

Assistant:

void SGP4::DeepSpacePeriodics(
        const double tsince,
        const DeepSpaceConstants& ds_constants,
        double& em,
        double& xinc,
        double& omgasm,
        double& xnodes,
        double& xll)
{
    static const double ZES = 0.01675;
    static const double ZNS = 1.19459E-5;
    static const double ZNL = 1.5835218E-4;
    static const double ZEL = 0.05490;

    // calculate solar terms for time tsince
    double zm = ds_constants.zmos + ZNS * tsince;
    double zf = zm + 2.0 * ZES * sin(zm);
    double sinzf = sin(zf);
    double f2 = 0.5 * sinzf * sinzf - 0.25;
    double f3 = -0.5 * sinzf * cos(zf);

    const double ses = ds_constants.se2 * f2
        + ds_constants.se3 * f3;
    const double sis = ds_constants.si2 * f2
        + ds_constants.si3 * f3;
    const double sls = ds_constants.sl2 * f2
        + ds_constants.sl3 * f3
        + ds_constants.sl4 * sinzf;
    const double sghs = ds_constants.sgh2 * f2
        + ds_constants.sgh3 * f3
        + ds_constants.sgh4 * sinzf;
    const double shs = ds_constants.sh2 * f2
        + ds_constants.sh3 * f3;

    // calculate lunar terms for time tsince
    zm = ds_constants.zmol + ZNL * tsince;
    zf = zm + 2.0 * ZEL * sin(zm);
    sinzf = sin(zf);
    f2 = 0.5 * sinzf * sinzf - 0.25;
    f3 = -0.5 * sinzf * cos(zf);

    const double sel = ds_constants.ee2 * f2
        + ds_constants.e3 * f3;
    const double sil = ds_constants.xi2 * f2
        + ds_constants.xi3 * f3;
    const double sll = ds_constants.xl2 * f2
        + ds_constants.xl3 * f3
        + ds_constants.xl4 * sinzf;
    const double sghl = ds_constants.xgh2 * f2
        + ds_constants.xgh3 * f3
        + ds_constants.xgh4 * sinzf;
    const double shl = ds_constants.xh2 * f2
        + ds_constants.xh3 * f3;

    // merge calculated values
    const double pe = ses + sel;
    const double pinc = sis + sil;
    const double pl = sls + sll;
    const double pgh = sghs + sghl;
    const double ph = shs + shl;

    xinc += pinc;
    em += pe;

    /* Spacetrack report #3 has sin/cos from before perturbations
     * added to xinc (oldxinc), but apparently report # 6 has then
     * from after they are added.
     * use for strn3
     * if (elements_.Inclination() >= 0.2)
     * use for gsfc
     * if (xinc >= 0.2)
     * (moved from start of function)
     */
    const double sinis = sin(xinc);
    const double cosis = cos(xinc);

    if (xinc >= 0.2)
    {
        // apply periodics directly
        omgasm += pgh - cosis * ph / sinis;
        xnodes += ph / sinis;
        xll += pl;
    }
    else
    {
        // apply periodics with lyddane modification
        const double sinok = sin(xnodes);
        const double cosok = cos(xnodes);
        double alfdp = sinis * sinok;
        double betdp = sinis * cosok;
        const double dalf = ph * cosok + pinc * cosis * sinok;
        const double dbet = -ph * sinok + pinc * cosis * cosok;
        alfdp += dalf;
        betdp += dbet;
        xnodes = Util::WrapTwoPI(xnodes);
        double xls = xll + omgasm + cosis * xnodes;
        double dls = pl + pgh - pinc * xnodes * sinis;
        xls += dls;
        const double oldxnodes = xnodes;
        xnodes = atan2(alfdp, betdp);
        /**
         * Get perturbed xnodes in to same quadrant as original.
         * RAAN is in the range of 0 to 360 degrees
         * atan2 is in the range of -180 to 180 degrees
         */
        if (fabs(oldxnodes - xnodes) > kPI)
        {
            if (xnodes < oldxnodes)
            {
                xnodes += kTWOPI;
            }
            else
            {
                xnodes -= kTWOPI;
            }
        }

        xll += pl;
        omgasm = xls - xll - cosis * xnodes;
    }
}